

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O1

int JacB(sunrealtype tt,sunrealtype cj,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,
        N_Vector rrB,SUNMatrix JB,void *user_data,N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long *plVar6;
  double *pdVar7;
  double *pdVar8;
  undefined8 *puVar9;
  double dVar10;
  
  lVar5 = *(long *)((long)yy->content + 0x10);
  dVar1 = *(double *)(lVar5 + 8);
  dVar2 = *user_data;
  dVar3 = *(double *)((long)user_data + 8);
  dVar4 = *(double *)((long)user_data + 0x10);
  plVar6 = *(long **)((long)JB->content + 0x20);
  pdVar7 = (double *)*plVar6;
  dVar10 = *(double *)(lVar5 + 0x10) * dVar3;
  *pdVar7 = cj - dVar2;
  pdVar8 = (double *)plVar6[1];
  *pdVar8 = dVar2;
  puVar9 = (undefined8 *)plVar6[2];
  *puVar9 = 0xbff0000000000000;
  pdVar7[1] = dVar10;
  pdVar8[1] = cj - ((dVar4 + dVar4) * dVar1 + dVar10);
  puVar9[1] = 0xbff0000000000000;
  pdVar7[2] = dVar1 * dVar3;
  pdVar8[2] = -dVar3 * dVar1;
  puVar9[2] = 0xbff0000000000000;
  return 0;
}

Assistant:

static int JacB(sunrealtype tt, sunrealtype cj, N_Vector yy, N_Vector yp,
                N_Vector yyB, N_Vector ypB, N_Vector rrB, SUNMatrix JB,
                void* user_data, N_Vector tmp1B, N_Vector tmp2B, N_Vector tmp3B)
{
  sunrealtype y2, y3;
  UserData data;
  sunrealtype p1, p2, p3;

  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  IJth(JB, 1, 1) = -p1 + cj;
  IJth(JB, 1, 2) = p1;
  IJth(JB, 1, 3) = -ONE;

  IJth(JB, 2, 1) = p2 * y3;
  IJth(JB, 2, 2) = -(p2 * y3 + SUN_RCONST(2.0) * p3 * y2) + cj;
  IJth(JB, 2, 3) = -ONE;

  IJth(JB, 3, 1) = p2 * y2;
  IJth(JB, 3, 2) = -p2 * y2;
  IJth(JB, 3, 3) = -ONE;

  return (0);
}